

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O0

bool QXmlUtils::isEncName(QStringView encName)

{
  bool bVar1;
  char16_t *pcVar2;
  const_iterator pvVar3;
  long in_FS_OFFSET;
  char16_t cp;
  const_iterator __end1;
  const_iterator __begin1;
  QStringView *__range1;
  char16_t first;
  QChar ch;
  QStringView *in_stack_ffffffffffffffb0;
  const_iterator local_48;
  undefined2 in_stack_ffffffffffffffc8;
  char16_t cVar4;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  QChar in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffd0 [16];
  QChar local_1a [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QStringView::isEmpty((QStringView *)0x4b0cba);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    local_1a[0] = QStringView::front(in_stack_ffffffffffffffb0);
    pcVar2 = QChar::unicode(local_1a);
    cVar4 = *pcVar2;
    bVar1 = QtMiscUtils::isAsciiLower((uint)(ushort)cVar4);
    if (!bVar1) {
      bVar1 = QtMiscUtils::isAsciiUpper((uint)(ushort)cVar4);
      if (!bVar1) {
        bVar1 = false;
        goto LAB_004b0de9;
      }
    }
    QStringView::mid((QStringView *)
                     CONCAT26(in_stack_ffffffffffffffce.ucs,
                              CONCAT15(in_stack_ffffffffffffffcd,
                                       CONCAT14(in_stack_ffffffffffffffcc,
                                                CONCAT22(cVar4,in_stack_ffffffffffffffc8)))),
                     in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
    local_48 = QStringView::begin((QStringView *)0x4b0d54);
    pvVar3 = QStringView::end(in_stack_ffffffffffffffb0);
    for (; local_48 != pvVar3; local_48 = local_48 + 1) {
      pcVar2 = QChar::unicode((QChar *)&stack0xffffffffffffffce);
      cVar4 = *pcVar2;
      bVar1 = QtMiscUtils::isAsciiLetterOrNumber(L'\0');
      if ((((!bVar1) && (cVar4 != L'.')) && (cVar4 != L'_')) && (cVar4 != L'-')) {
        bVar1 = false;
        goto LAB_004b0de9;
      }
    }
    bVar1 = true;
  }
LAB_004b0de9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QXmlUtils::isEncName(QStringView encName)
{
    // Valid encoding names are given by "[A-Za-z][A-Za-z0-9._\\-]*"
    if (encName.isEmpty())
        return false;
    const auto first = encName.front().unicode();
    if (!(isAsciiLower(first) || isAsciiUpper(first)))
        return false;
    for (QChar ch : encName.mid(1)) {
        const auto cp = ch.unicode();
        if (isAsciiLetterOrNumber(cp) || cp == '.' || cp == '_' || cp == '-')
            continue;
        return false;
    }
    return true;
}